

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFileParser::Parse(cmListFileParser *this)

{
  cmMessenger *this_00;
  ios_base iVar1;
  bool bVar2;
  cmListFileLexer_Token *pcVar3;
  char *pcVar4;
  size_t sVar5;
  ostringstream error;
  string local_258;
  long *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_228;
  _Storage<cmListFileContext,_false> local_218;
  ios_base local_1a8 [264];
  cmListFileContext local_a0;
  
  pcVar3 = cmListFileLexer_Scan(this->Lexer);
  if (pcVar3 != (cmListFileLexer_Token *)0x0) {
    local_230 = &this->FunctionName;
    local_238 = &this->FunctionLine;
    bVar2 = true;
    do {
      switch(pcVar3->type) {
      case cmListFileLexer_Token_Space:
        break;
      case cmListFileLexer_Token_Newline:
        bVar2 = true;
        break;
      case cmListFileLexer_Token_Identifier:
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218._M_value);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_218._M_value,"Parse error.  Expected a newline, got ",0x26);
          pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)&local_258 +
                            (int)*(undefined8 *)
                                  ((long)local_218._M_value.Name._M_dataplus._M_p + -0x18) + 0x40);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_218._M_value,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_218._M_value," with text \"",0xc);
          pcVar4 = pcVar3->text;
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)&local_258 +
                            (int)*(undefined8 *)
                                  ((long)local_218._M_value.Name._M_dataplus._M_p + -0x18) + 0x40);
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_218._M_value,pcVar4,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218._M_value,"\".",2)
          ;
          std::__cxx11::stringbuf::str();
          IssueError(this,&local_258);
          goto LAB_0026bf1e;
        }
        bVar2 = ParseFunction(this,pcVar3->text,(long)pcVar3->line);
        if (!bVar2) {
          return (bool)0;
        }
        std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>::
        emplace_back<std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                  ((vector<cmListFileFunction,std::allocator<cmListFileFunction>> *)this->ListFile,
                   local_230,local_238,&this->FunctionLineEnd,&this->FunctionArguments);
      case cmListFileLexer_Token_CommentBracket:
        bVar2 = false;
        break;
      default:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218._M_value);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_218._M_value,"Parse error.  Expected a command name, got ",0x2b
                  );
        pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar3->type);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)&local_258 +
                          (int)*(undefined8 *)
                                ((long)local_218._M_value.Name._M_dataplus._M_p + -0x18) + 0x40);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_218._M_value,pcVar4,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_218._M_value," with text \"",0xc);
        pcVar4 = pcVar3->text;
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)&local_258 +
                          (int)*(undefined8 *)
                                ((long)local_218._M_value.Name._M_dataplus._M_p + -0x18) + 0x40);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_218._M_value,pcVar4,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_218._M_value,"\".",2);
        std::__cxx11::stringbuf::str();
        IssueError(this,&local_258);
LAB_0026bf1e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218._M_value);
        std::ios_base::~ios_base(local_1a8);
        return (bool)0;
      }
      pcVar3 = cmListFileLexer_Scan(this->Lexer);
    } while (pcVar3 != (cmListFileLexer_Token *)0x0);
  }
  CheckNesting((optional<cmListFileContext> *)&local_218._M_value,this);
  iVar1 = local_1a8[0];
  if (local_1a8[0] == (ios_base)0x1) {
    this_00 = this->Messenger;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,"Flow control statements are not properly nested.","");
    cmListFileContext::cmListFileContext(&local_a0,&local_218._M_value);
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
              (&local_228,(cmListFileContext *)&this->Backtrace);
    cmMessenger::IssueMessage(this_00,FATAL_ERROR,&local_258,(cmListFileBacktrace *)&local_228);
    if (local_228.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((local_a0.DeferId.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (local_a0.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false,
       local_a0.DeferId.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_dataplus._M_p !=
       ((pointer)
       ((long)&local_a0.DeferId.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       + 0x10U))._M_p)) {
      operator_delete((void *)local_a0.DeferId.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p,
                      local_a0.DeferId.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.FilePath._M_dataplus._M_p != &local_a0.FilePath.field_2) {
      operator_delete(local_a0.FilePath._M_dataplus._M_p,
                      local_a0.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.Name._M_dataplus._M_p != &local_a0.Name.field_2) {
      operator_delete(local_a0.Name._M_dataplus._M_p,local_a0.Name.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
  }
  if (((byte)local_1a8[0] & 1) != 0) {
    std::_Optional_payload_base<cmListFileContext>::_M_destroy
              ((_Optional_payload_base<cmListFileContext> *)&local_218._M_value);
  }
  return (bool)((byte)iVar1 ^ 1);
}

Assistant:

bool cmListFileParser::Parse()
{
  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while (cmListFileLexer_Token* token = cmListFileLexer_Scan(this->Lexer)) {
    if (token->type == cmListFileLexer_Token_Space) {
    } else if (token->type == cmListFileLexer_Token_Newline) {
      haveNewline = true;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      haveNewline = false;
    } else if (token->type == cmListFileLexer_Token_Identifier) {
      if (haveNewline) {
        haveNewline = false;
        if (this->ParseFunction(token->text, token->line)) {
          this->ListFile->Functions.emplace_back(
            std::move(this->FunctionName), this->FunctionLine,
            this->FunctionLineEnd, std::move(this->FunctionArguments));
        } else {
          return false;
        }
      } else {
        std::ostringstream error;
        error << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        this->IssueError(error.str());
        return false;
      }
    } else {
      std::ostringstream error;
      error << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  // Check if all functions are nested properly.
  if (auto badNesting = this->CheckNesting()) {
    this->Messenger->IssueMessage(
      MessageType::FATAL_ERROR,
      "Flow control statements are not properly nested.",
      this->Backtrace.Push(*badNesting));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}